

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringGet(TranslateToFuzzReader *this,Type type)

{
  Expression *ref;
  Expression *pos;
  StringWTF16Get *pSVar1;
  
  if (type.id == 2) {
    ref = makeTrappingRefUse(this,(HeapType)0x50);
    pos = make(this,(Type)0x2);
    pSVar1 = Builder::makeStringWTF16Get(&this->builder,ref,pos);
    return (Expression *)pSVar1;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xeb1,"Expression *wasm::TranslateToFuzzReader::makeStringGet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStringGet(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* pos = make(Type::i32);
  return builder.makeStringWTF16Get(ref, pos);
}